

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Iterator::Current(Iterator *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  
  if ((this->value_).ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
    pbVar1 = (this->iterator_)._M_current;
    (p->_M_dataplus)._M_p = (pointer)&p->field_2;
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)p,pcVar2,pcVar2 + pbVar1->_M_string_length);
    scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::reset(&this->value_,p);
  }
  return (this->value_).ptr_;
}

Assistant:

virtual const T* Current() const {
      if (value_.get() == NULL)
        value_.reset(new T(*iterator_));
      return value_.get();
    }